

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateInterfaceProperties
          (cmExportInstallAndroidMKGenerator *this,cmGeneratorTarget *target,ostream *os,
          ImportPropertyMap *properties)

{
  string config;
  
  config._M_dataplus._M_p = (pointer)&config.field_2;
  config._M_string_length = 0;
  config.field_2._M_local_buf[0] = '\0';
  if ((this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)&config);
  }
  cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(target,os,properties,INSTALL,&config)
  ;
  std::__cxx11::string::~string((string *)&config);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateInterfaceProperties(
  cmGeneratorTarget const* target, std::ostream& os,
  const ImportPropertyMap& properties)
{
  std::string config;
  if (!this->Configurations.empty()) {
    config = this->Configurations[0];
  }
  cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
    target, os, properties, cmExportBuildAndroidMKGenerator::INSTALL, config);
}